

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader14.cpp
# Opt level: O3

void __thiscall COLLADASaxFWL::MeshLoader14::begin__polygons(MeshLoader14 *this)

{
  polygons__AttributeData *in_RSI;
  
  begin__polygons((MeshLoader14 *)&this[-1].super_SourceArrayLoader14.mLoader,in_RSI);
  return;
}

Assistant:

bool MeshLoader14::begin__polygons( const COLLADASaxFWL14::polygons__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__polygons(attributeData));
COLLADASaxFWL::polygons__AttributeData attrData;
attrData.present_attributes = 0;
attrData.name = attributeData.name;
attrData.material = attributeData.material;
if ( (attributeData.present_attributes & COLLADASaxFWL14::polygons__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL14::polygons__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::polygons__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__polygons(attrData);
}